

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

matches * atomtab_a(iasctx *ctx,void *v,int spos)

{
  int iVar1;
  matches *a;
  matches *b;
  long lVar2;
  match *pmVar3;
  undefined8 *puVar4;
  int *piVar5;
  byte bVar6;
  match in_stack_fffffffffffffe58;
  match sm;
  
  bVar6 = 0;
  a = emptymatches();
  piVar5 = (int *)((long)v + 0x314);
  while( true ) {
    iVar1 = var_ok(piVar5[-1],*piVar5,ctx->varinfo);
    if (iVar1 != 0) {
      memset(&sm,0,0xb8);
      sm.a[0] = *(ull *)(piVar5 + -0xc5);
      sm.m[0] = *(ull *)(piVar5 + -0xc3);
      sm.lpos = spos;
      pmVar3 = &sm;
      puVar4 = (undefined8 *)&stack0xfffffffffffffe58;
      for (lVar2 = 0x17; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = *(undefined8 *)pmVar3;
        pmVar3 = (match *)((long)pmVar3 + (ulong)bVar6 * -0x10 + 8);
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      }
      b = tabdesc(ctx,in_stack_fffffffffffffe58,(atom *)(piVar5 + -0xc1));
      if (b != (matches *)0x0) {
        catmatches(a,b);
      }
    }
    if (((*(long *)(piVar5 + -0xc3) == 0) && (piVar5[-1] == 0)) && (*piVar5 == 0)) break;
    piVar5 = piVar5 + 0xc6;
  }
  return a;
}

Assistant:

struct matches *atomtab_a APROTO {
	const struct insn *tab = v;
	struct matches *res = emptymatches();
	int i;
	for (i = 0; ; i++) {
		if (var_ok(tab[i].fmask, tab[i].ptype, ctx->varinfo)) {
			struct match sm = { 0, .a = {tab[i].val}, .m = {tab[i].mask}, .lpos = spos };
			struct matches *subm = tabdesc(ctx, sm, tab[i].atoms);
			if (subm)
				res = catmatches(res, subm);
		}
		if (!tab[i].mask && !tab[i].fmask && !tab[i].ptype) break;
	}
	return res;
}